

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HeapImpl.h
# Opt level: O2

Chuck * FindSmallestFitInHeap(Heap *heap,Size size)

{
  byte bVar1;
  ChuckLayout *pCVar2;
  ulong uVar3;
  Size size_00;
  
  if (size < 0x218) {
    bVar1 = MatchExact(size);
    uVar3 = (ulong)bVar1;
    do {
      if (uVar3 == 0x40) goto LAB_001026e9;
      pCVar2 = heap->exact[uVar3];
      uVar3 = uVar3 + 1;
    } while (pCVar2 == (Chuck *)0x0);
  }
  else {
LAB_001026e9:
    size_00 = 0x218;
    if (0x218 < size) {
      size_00 = size;
    }
    bVar1 = MatchSorted(size_00);
    uVar3 = (ulong)bVar1;
    do {
      if (uVar3 == 0x40) {
        pCVar2 = (Chuck *)0x0;
        break;
      }
      pCVar2 = heap->sorted[uVar3];
      uVar3 = uVar3 + 1;
    } while (pCVar2 == (Chuck *)0x0);
  }
  while( true ) {
    if (pCVar2 == (Chuck *)0x0) {
      return (Chuck *)0x0;
    }
    uVar3 = (ulong)(*(uint *)&pCVar2->field_0x4 >> 1);
    if (((&pCVar2->field_0x4)[uVar3 * 8] & 1) != 0) break;
    if (size <= uVar3 << 3) {
      return pCVar2;
    }
    pCVar2 = pCVar2->next;
  }
  __assert_fail("!GetUsed(current)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Qcloud1223[P]libNanoNF/Source/HeapImpl.h"
                ,0x71,"Chuck *FindSmallestFit(Chuck *, Size)");
}

Assistant:

static Chuck *FindSmallestFitInHeap(Heap *heap, Size size) {
    Chuck *start = NULL;
    if (size < NOT_EXACT_MIN) {
        for (int i = MatchExact(size); i < 64; i += 1) {
            if (heap->exact[i]) {
                start = heap->exact[i];
                break;
            }
        }
    }
    if (!start) {
        for (int i = MatchSorted(size > NOT_EXACT_MIN ? size : NOT_EXACT_MIN);
             i < 64; i += 1) {
            if (heap->sorted[i]) {
                start = heap->sorted[i];
                break;
            }
        }
    }
    return FindSmallestFit(start, size);
}